

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i8255.hpp
# Opt level: O2

void __thiscall
Intel::i8255::
i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::
update_outputs(i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
               *this)

{
  byte bVar1;
  
  bVar1 = this->control_;
  if ((bVar1 & 0x10) == 0) {
    MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::set_value
              (this->port_handler_,0,this->outputs_[0]);
    bVar1 = this->control_;
  }
  if ((bVar1 & 2) == 0) {
    MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::set_value
              (this->port_handler_,1,this->outputs_[1]);
  }
  MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler::set_value
            (this->port_handler_,2,this->outputs_[2]);
  return;
}

Assistant:

void update_outputs() {
			if(!(control_ & 0x10)) port_handler_.set_value(0, outputs_[0]);
			if(!(control_ & 0x02)) port_handler_.set_value(1, outputs_[1]);
			port_handler_.set_value(2, outputs_[2]);
		}